

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O2

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CAddressOfField::ToExpression(CAddressOfField *this)

{
  _Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_> this_00;
  tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_> this_01;
  CMemExpression *this_02;
  pointer *__ptr;
  long in_RSI;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_40;
  __uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_38;
  __uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_30;
  
  if (*(int *)(in_RSI + 0x10) == 0) {
    (**(code **)(**(long **)(in_RSI + 8) + 0x10))(&local_48);
    local_30._M_t.
    super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
         (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
         (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
         local_48._M_head_impl;
  }
  else {
    this_00.super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
         (_Head_base<0UL,_const_IRT::CExpression_*,_false>)operator_new(0x20);
    (**(code **)(**(long **)(in_RSI + 8) + 0x10))(&local_48);
    local_40._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (CExpression *)0x0;
    this_01.
    super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
         operator_new(0x10);
    CConstExpression::CConstExpression
              ((CConstExpression *)
               this_01.
               super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
               .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl,
               *(int *)(in_RSI + 0x10));
    local_38._M_t.
    super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
         (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
         (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
         this_01.
         super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
         .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    CBinopExpression::CBinopExpression
              ((CBinopExpression *)
               this_00.super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_40,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_38,PLUS);
    if ((_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
        local_38._M_t.
        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl != (CExpression *)0x0)
    {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                            .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl +
                  0x10))();
    }
    local_38._M_t.
    super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
         (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
         (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
         0x0;
    if ((CBinopExpression *)local_40._M_head_impl != (CBinopExpression *)0x0) {
      (*(((CExpression *)&(local_40._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_40._M_head_impl = (CExpression *)0x0;
    local_30._M_t.
    super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
         (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
         (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
         this_00.super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    if ((CBinopExpression *)local_48._M_head_impl != (CBinopExpression *)0x0) {
      (*(((CExpression *)&(local_48._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
  }
  this_02 = (CMemExpression *)operator_new(0x10);
  CMemExpression::CMemExpression
            (this_02,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_30);
  (this->super_IAddress)._vptr_IAddress = (_func_int **)this_02;
  if ((_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
      local_30._M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl != (CExpression *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                          .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl +
                0x10))();
  }
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CExpression> CAddressOfField::ToExpression() const {
    std::unique_ptr<const CExpression> offsetExpression;
    if (offset != 0) {
        offsetExpression = std::move(std::unique_ptr<const CExpression>(
                new CBinopExpression(
                        std::move(thisAddress->ToExpression()),
                        std::move(std::unique_ptr<const CExpression>(
                                new CConstExpression(offset)
                        )),
                        TOperationType::PLUS
                )
        ));
    } else {
        offsetExpression = std::move(thisAddress->ToExpression());
    }
    return std::move(std::unique_ptr<const CExpression>(
            new CMemExpression(std::move(offsetExpression))
    ));
}